

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_error_or.cpp
# Opt level: O3

void __thiscall ErrorOrN_Bind_Test::TestBody(ErrorOrN_Bind_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  tuple<int,_int,_int> *ptVar4;
  error_code *peVar5;
  int *piVar6;
  pointer *__ptr;
  char *message;
  char *in_R9;
  error_code eVar7;
  error_or<int> y;
  error_or_n<int,_int,_int> eo;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  Message local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  AssertHelper local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  error_or<int> local_40;
  error_or<std::tuple<int,_int,_int>_> local_28;
  
  local_28.has_error_ = false;
  ptVar4 = pstore::error_or<std::tuple<int,int,int>>::
           value_storage_impl<pstore::error_or<std::tuple<int,int,int>>&,std::tuple<int,int,int>>
                     (&local_28);
  (ptVar4->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)&DAT_500000007;
  (ptVar4->super__Tuple_impl<0UL,_int,_int,_int>).super__Head_base<0UL,_int,_false>._M_head_impl = 3
  ;
  if (local_28.has_error_ == false) {
    ptVar4 = pstore::error_or<std::tuple<int,int,int>>::
             value_storage_impl<pstore::error_or<std::tuple<int,int,int>>const&,std::tuple<int,int,int>const>
                       (&local_28);
    iVar1 = (ptVar4->super__Tuple_impl<0UL,_int,_int,_int>).super__Head_base<0UL,_int,_false>.
            _M_head_impl;
    iVar2 = (ptVar4->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl;
    iVar3 = (ptVar4->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>.
            super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    local_40.has_error_ = false;
    piVar6 = pstore::error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_40);
    *piVar6 = iVar1 + iVar2 + iVar3;
  }
  else {
    eVar7 = pstore::error_or<std::tuple<int,_int,_int>_>::get_error(&local_28);
    local_40.has_error_ = true;
    peVar5 = pstore::error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>
                       (&local_40);
    peVar5->_M_value = eVar7._M_value;
    peVar5->_M_cat = eVar7._M_cat;
  }
  local_78.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_78.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,local_40.has_error_) ^ 1;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_40.has_error_ != false) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_78,(AssertionResult *)0x1fc77c,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_error_or.cpp"
               ,0x98,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
    }
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
  }
  piVar6 = pstore::error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_40);
  local_78.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0xf;
  testing::internal::CmpHelperEQ<int,int>((internal *)local_60,"*y","15",piVar6,(int *)&local_78);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message(&local_78);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_error_or.cpp"
               ,0x99,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((long *)CONCAT44(local_78.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (uint)local_78.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_78.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (uint)local_78.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl) + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  if (local_40.has_error_ == false) {
    pstore::error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_40);
  }
  else {
    pstore::error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_40);
  }
  if (local_28.has_error_ == false) {
    pstore::error_or<std::tuple<int,int,int>>::
    value_storage_impl<pstore::error_or<std::tuple<int,int,int>>&,std::tuple<int,int,int>>
              (&local_28);
  }
  else {
    pstore::error_or<std::tuple<int,int,int>>::
    error_storage_impl<pstore::error_or<std::tuple<int,int,int>>&,std::error_code>(&local_28);
  }
  return;
}

Assistant:

TEST (ErrorOrN, Bind) {
    pstore::error_or_n<int, int, int> eo{pstore::in_place, 3, 5, 7};
    pstore::error_or<int> y = eo >>= [] (int a, int b, int c) {
        return pstore::error_or<int>{pstore::in_place, a + b + c};
    };
    EXPECT_TRUE (y);
    EXPECT_EQ (*y, 15);
}